

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

TransformSet * pbrt::Inverse(TransformSet *ts)

{
  TransformSet *in_RDI;
  int i;
  Transform *in_stack_ffffffffffffff70;
  int local_c;
  
  TransformSet::TransformSet((TransformSet *)in_stack_ffffffffffffff70);
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    Inverse(in_stack_ffffffffffffff70);
    memcpy(in_RDI->t + local_c,&stack0xffffffffffffff74,0x80);
  }
  return in_RDI;
}

Assistant:

TransformSet Inverse(const TransformSet &ts) {
        TransformSet tInv;
        for (int i = 0; i < MaxTransforms; ++i)
            tInv.t[i] = Inverse(ts.t[i]);
        return tInv;
    }